

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O2

void __thiscall
CoreML::NeuralNetworkShaper::shapeSimpleRecurrentLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  size_t val;
  Type *pTVar1;
  mapped_type *this_01;
  mapped_type *this_02;
  mapped_type *this_03;
  mapped_type *this_04;
  ShapeRange *other;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *this_05;
  undefined1 *puVar2;
  
  this_05 = &this->blobShapes;
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->input_).super_RepeatedPtrFieldBase,0);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](this_05,pTVar1);
  this_00 = &specLayer->output_;
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&this_00->super_RepeatedPtrFieldBase,0);
  this_02 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](this_05,pTVar1);
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&this_00->super_RepeatedPtrFieldBase,0);
  ShapeConstraint::setName(this_02,pTVar1);
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->input_).super_RepeatedPtrFieldBase,1);
  this_03 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](this_05,pTVar1);
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&this_00->super_RepeatedPtrFieldBase,1);
  this_04 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](this_05,pTVar1);
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&this_00->super_RepeatedPtrFieldBase,1);
  ShapeConstraint::setName(this_04,pTVar1);
  if (specLayer->_oneof_case_[0] == 400) {
    puVar2 = *(undefined1 **)&specLayer->layer_;
  }
  else {
    puVar2 = Specification::_SimpleRecurrentLayerParams_default_instance_;
  }
  val = ((SimpleRecurrentLayerParams *)puVar2)->outputvectorsize_;
  ShapeConstraint::setChannel(this_01,((BatchnormLayerParams *)puVar2)->channels_);
  ShapeConstraint::setHeight(this_01,1);
  ShapeConstraint::setWidth(this_01,1);
  ShapeConstraint::setChannel(this_02,val);
  ShapeConstraint::setHeight(this_02,1);
  ShapeConstraint::setWidth(this_02,1);
  if (((PoolingLayerParams *)puVar2)->avgpoolexcludepadding_ == true) {
    other = ShapeConstraint::sequenceRange(this_01);
    ShapeConstraint::updateSequenceRange(this_02,other);
  }
  else {
    ShapeConstraint::setSequence(this_02,1);
  }
  ShapeConstraint::setSequence(this_03,1);
  ShapeConstraint::setChannel(this_03,val);
  ShapeConstraint::setHeight(this_03,1);
  ShapeConstraint::setWidth(this_03,1);
  ShapeConstraint::setSequence(this_04,1);
  ShapeConstraint::setChannel(this_04,val);
  ShapeConstraint::setHeight(this_04,1);
  ShapeConstraint::setWidth(this_04,1);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeSimpleRecurrentLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

    ShapeConstraint& stateInShape = blobShapes[specLayer.input(1)];
    ShapeConstraint& stateOutShape = blobShapes[specLayer.output(1)];
    stateOutShape.setName(specLayer.output(1));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Simple Recurrent layer " << specLayer.name() << " input shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Simple Recurrent layer " << specLayer.name() << " output shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

    const Specification::SimpleRecurrentLayerParams& recurrent = specLayer.simplerecurrent();

    size_t inSize = (size_t)recurrent.inputvectorsize();
    size_t outSize = (size_t)recurrent.outputvectorsize();

    inputShape.setChannel(inSize);
    inputShape.setHeight(1);
    inputShape.setWidth(1);

    outputShape.setChannel(outSize);
    outputShape.setHeight(1);
    outputShape.setWidth(1);

    if (recurrent.sequenceoutput()) {
        outputShape.updateSequenceRange(inputShape.sequenceRange());
    }
    else {
        outputShape.setSequence(1);
    }

    stateInShape.setSequence(1);
    stateInShape.setChannel(outSize);
    stateInShape.setHeight(1);
    stateInShape.setWidth(1);

    stateOutShape.setSequence(1);
    stateOutShape.setChannel(outSize);
    stateOutShape.setHeight(1);
    stateOutShape.setWidth(1);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Simple Recurrent layer " << specLayer.name() << " input shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Simple Recurrent layer " << specLayer.name() << " output shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

}